

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFOutlineObjectHelper::QPDFOutlineObjectHelper
          (QPDFOutlineObjectHelper *this,QPDFObjectHandle *a_oh,QPDFOutlineDocumentHelper *dh,
          int depth)

{
  QPDFOutlineDocumentHelper *dh_00;
  bool bVar1;
  Members *this_00;
  element_type *peVar2;
  QPDFObjGen og;
  bool local_19a;
  allocator<char> local_149;
  string local_148 [32];
  QPDFObjectHandle local_128;
  undefined1 local_118 [40];
  QPDFOutlineObjectHelper new_ooh;
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  QPDFObjectHandle cur;
  set children;
  QPDFObjectHandle local_38;
  int local_24;
  QPDFOutlineDocumentHelper *pQStack_20;
  int depth_local;
  QPDFOutlineDocumentHelper *dh_local;
  QPDFObjectHandle *a_oh_local;
  QPDFOutlineObjectHelper *this_local;
  
  local_24 = depth;
  pQStack_20 = dh;
  dh_local = (QPDFOutlineDocumentHelper *)a_oh;
  a_oh_local = (QPDFObjectHandle *)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_38,a_oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFOutlineObjectHelper_0058ebf8;
  this_00 = (Members *)operator_new(0x30);
  Members::Members(this_00,pQStack_20);
  std::shared_ptr<QPDFOutlineObjectHelper::Members>::
  shared_ptr<QPDFOutlineObjectHelper::Members,void>(&this->m,this_00);
  if (local_24 < 0x33) {
    peVar2 = std::
             __shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    dh_00 = peVar2->dh;
    og = QPDFObjectHandle::getObjGen(a_oh);
    bVar1 = QPDFOutlineDocumentHelper::Accessor::checkSeen(dh_00,og);
    if (bVar1) {
      QTC::TC("qpdf","QPDFOutlineObjectHelper loop",0);
    }
    else {
      QPDFObjGen::set::set
                ((set *)&cur.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"/First",&local_b1);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_90,(string *)a_oh);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator(&local_b1);
      while( true ) {
        bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_90);
        local_19a = false;
        if (!bVar1) {
          bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_90);
          local_19a = false;
          if (bVar1) {
            register0x00000000 =
                 ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_90);
            local_19a = QPDFObjGen::set::add
                                  ((set *)&cur.super_BaseHandle.obj.
                                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount,register0x00000000);
          }
        }
        if (local_19a == false) break;
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)(local_118 + 0x10),(QPDFObjectHandle *)local_90);
        QPDFOutlineObjectHelper
                  ((QPDFOutlineObjectHelper *)(local_118 + 0x20),
                   (QPDFObjectHandle *)(local_118 + 0x10),pQStack_20,local_24 + 1);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_118 + 0x10));
        std::make_shared<QPDFOutlineObjectHelper,QPDFOutlineObjectHelper&>
                  ((QPDFOutlineObjectHelper *)local_118);
        peVar2 = std::
                 __shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&new_ooh.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        std::shared_ptr<QPDFOutlineObjectHelper>::operator=
                  (&peVar2->parent,(shared_ptr<QPDFOutlineObjectHelper> *)local_118);
        std::shared_ptr<QPDFOutlineObjectHelper>::~shared_ptr
                  ((shared_ptr<QPDFOutlineObjectHelper> *)local_118);
        peVar2 = std::
                 __shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
        std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
                  (&peVar2->kids,(value_type *)(local_118 + 0x20));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_148,"/Next",&local_149);
        QPDFObjectHandle::getKey(&local_128,(string *)local_90);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_90,&local_128);
        QPDFObjectHandle::~QPDFObjectHandle(&local_128);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator(&local_149);
        ~QPDFOutlineObjectHelper((QPDFOutlineObjectHelper *)(local_118 + 0x20));
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
      QPDFObjGen::set::~set
                ((set *)&cur.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

QPDFOutlineObjectHelper::QPDFOutlineObjectHelper(
    QPDFObjectHandle a_oh, QPDFOutlineDocumentHelper& dh, int depth) :
    QPDFObjectHelper(a_oh),
    m(new Members(dh))
{
    if (depth > 50) {
        // Not exercised in test suite, but was tested manually by temporarily changing max depth
        // to 1.
        return;
    }
    if (QPDFOutlineDocumentHelper::Accessor::checkSeen(m->dh, a_oh.getObjGen())) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper loop");
        return;
    }

    QPDFObjGen::set children;
    QPDFObjectHandle cur = a_oh.getKey("/First");
    while (!cur.isNull() && cur.isIndirect() && children.add(cur)) {
        QPDFOutlineObjectHelper new_ooh(cur, dh, 1 + depth);
        new_ooh.m->parent = std::make_shared<QPDFOutlineObjectHelper>(*this);
        m->kids.push_back(new_ooh);
        cur = cur.getKey("/Next");
    }
}